

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::FilterHandle_const&,std::__cxx11::string_const&,pbrt::Bounds2<int>const&>
               (string *s,char *fmt,FilterHandle *v,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               Bounds2<int> *args_1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  Bounds2<int> *in_R8;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  FilterHandle *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdd0;
  char **in_stack_fffffffffffffdd8;
  char **in_stack_fffffffffffffde0;
  FilterHandle *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  string local_208 [32];
  stringstream local_1e8 [48];
  char *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  LogLevel in_stack_fffffffffffffe64;
  string local_48 [32];
  
  copyToFormatString(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  lVar1 = std::__cxx11::string::find((char)local_48,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_48,0x73);
  lVar3 = std::__cxx11::string::find((char)local_48,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               in_stack_fffffffffffffe48);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::FilterHandle_const&>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffdb0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1e8);
    pbrt::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(in_RDI,local_208);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::__cxx11::stringstream::~stringstream(local_1e8);
  }
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::Bounds2<int>const&>
            (in_RSI,in_RDX,in_RCX,in_R8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}